

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall
CommandPlayerType::Tick
          (CommandPlayerType *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  bool bVar1;
  uint uVar2;
  SBarInfoCommand **ppSVar3;
  long *plVar4;
  PClassPlayerPawn *pPVar5;
  PClassPlayerPawn *pPVar6;
  uint uVar7;
  PClassPlayerPawn *pPVar8;
  ulong uVar9;
  long lVar10;
  
  bVar1 = (this->super_SBarInfoCommandFlowControl).truth;
  uVar9 = (ulong)(this->super_SBarInfoCommandFlowControl).commands[bVar1].
                 super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count;
  if (uVar9 != 0) {
    ppSVar3 = (this->super_SBarInfoCommandFlowControl).commands[bVar1].
              super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array;
    lVar10 = 0;
    do {
      plVar4 = *(long **)((long)ppSVar3 + lVar10);
      (**(code **)(*plVar4 + 0x28))(plVar4,block,statusBar,hudChanged);
      lVar10 = lVar10 + 8;
    } while (uVar9 << 3 != lVar10);
  }
  pPVar5 = ((statusBar->super_DBaseStatusBar).CPlayer)->cls;
  if (pPVar5 != (PClassPlayerPawn *)0x0) {
    uVar2 = (this->classes).Count;
    if (uVar2 != 0) {
      uVar7 = 0;
      do {
        pPVar6 = (PClassPlayerPawn *)(this->classes).Array[uVar7];
        pPVar8 = pPVar5;
        if (pPVar5 == pPVar6) {
LAB_006277da:
          if ((this->super_SBarInfoCommandFlowControl).truth != false) {
            return;
          }
          (this->super_SBarInfoCommandFlowControl).truth = true;
          goto LAB_006277e4;
        }
        do {
          pPVar8 = (PClassPlayerPawn *)(pPVar8->super_PClassActor).super_PClass.ParentClass;
          if (pPVar8 == pPVar6) break;
        } while (pPVar8 != (PClassPlayerPawn *)0x0);
        if (pPVar8 != (PClassPlayerPawn *)0x0) goto LAB_006277da;
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar2);
    }
    if ((this->super_SBarInfoCommandFlowControl).truth != false) {
      (this->super_SBarInfoCommandFlowControl).truth = false;
LAB_006277e4:
      if (block != (SBarInfoMainBlock *)0x0) {
        (*(this->super_SBarInfoCommandFlowControl).super_SBarInfoCommand._vptr_SBarInfoCommand[5])
                  (this,block,statusBar,1);
        return;
      }
    }
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoCommandFlowControl::Tick(block, statusBar, hudChanged);

			if(statusBar->CPlayer->cls == NULL)
				return; //No class so we can not continue
		
			for(unsigned int i = 0;i < classes.Size();i++)
			{
				if (statusBar->CPlayer->cls->IsDescendantOf(classes[i]))
				{
					SetTruth(true, block, statusBar);
					return;
				}
			}
			SetTruth(false, block, statusBar);
		}